

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O3

int netaddr_cmp_to_socket(netaddr *a1,netaddr_socket *a2)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar3 = (uint)a1->_type;
  iVar2 = uVar3 - (a2->v4).sin_family;
  if (iVar2 != 0) {
    return iVar2;
  }
  if (a1->_type == 10) {
    uVar7 = *(ulong *)a1->_addr;
    uVar5 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    uVar7 = *(ulong *)(a2->v4).sin_zero;
    uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    if (uVar5 == uVar7) {
      uVar7 = *(ulong *)(a1->_addr + 8);
      uVar1 = *(ulong *)((long)&(a2->v6).sin6_addr.__in6_u + 8);
      uVar5 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
              | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18
              | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      uVar7 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      uVar4 = 0;
      if (uVar5 == uVar7) goto LAB_0010a2cf;
    }
    uVar4 = -(uint)(uVar5 < uVar7) | 1;
  }
  else {
    if (uVar3 != 2) goto LAB_0010a2d3;
    uVar4 = *(uint *)a1->_addr;
    uVar6 = (a2->v6).sin6_flowinfo;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar4 = (uint)(uVar4 >= uVar6 && uVar4 != uVar6) - (uint)(uVar4 < uVar6);
  }
LAB_0010a2cf:
  if (uVar4 != 0) {
    return uVar4;
  }
LAB_0010a2d3:
  iVar2 = a1->_prefix_len - 0x20;
  if (uVar3 != 2) {
    iVar2 = a1->_prefix_len - 0x80;
  }
  return iVar2;
}

Assistant:

int
netaddr_cmp_to_socket(const struct netaddr *a1, const union netaddr_socket *a2) {
  int result = 0;

  result = (int)a1->_type - (int)a2->std.sa_family;
  if (result) {
    return result;
  }

  if (a1->_type == AF_INET) {
    result = memcmp(a1->_addr, &a2->v4.sin_addr, 4);
  }
  else if (a1->_type == AF_INET6) {
    /* ipv6 */
    result = memcmp(a1->_addr, &a2->v6.sin6_addr, 16);
  }

  if (result) {
    return result;
  }

  return (int)a1->_prefix_len - (a1->_type == AF_INET ? 32 : 128);
}